

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

int __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::ClassId(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
          *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  string sStack_5a560;
  TPZFrontSym<std::complex<long_double>_> TStack_5a540;
  TPZStackEqnStorage<std::complex<long_double>_> TStack_5a418;
  
  sStack_5a560._M_dataplus._M_p = (pointer)&sStack_5a560.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_5a560,"TPZFrontMatrix","");
  uVar1 = Hash(&sStack_5a560);
  iVar2 = TPZAbstractFrontMatrix<std::complex<long_double>_>::ClassId
                    (&this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>);
  TPZStackEqnStorage<std::complex<long_double>_>::TPZStackEqnStorage(&TStack_5a418);
  iVar3 = TPZStackEqnStorage<std::complex<long_double>_>::ClassId(&TStack_5a418);
  TPZFrontSym<std::complex<long_double>_>::TPZFrontSym(&TStack_5a540);
  iVar4 = TPZFrontSym<std::complex<long_double>_>::ClassId(&TStack_5a540);
  TPZFrontSym<std::complex<long_double>_>::~TPZFrontSym(&TStack_5a540);
  TPZStackEqnStorage<std::complex<long_double>_>::~TPZStackEqnStorage(&TStack_5a418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5a560._M_dataplus._M_p != &sStack_5a560.field_2) {
    operator_delete(sStack_5a560._M_dataplus._M_p,sStack_5a560.field_2._M_allocated_capacity + 1);
  }
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}